

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

my_rational my_rational_construct(uint numerator,uint denominator)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  my_rational mVar4;
  
  if (denominator != 0) {
    if (numerator == 0) {
      mVar4.n = 0;
      mVar4.d = 1;
    }
    else {
      uVar2 = (ulong)numerator;
      uVar3 = (ulong)denominator;
      while ((int)uVar3 != 0) {
        uVar1 = uVar2 % uVar3;
        uVar2 = uVar3;
        uVar3 = uVar1;
      }
      mVar4 = (my_rational)(numerator / uVar2 | denominator / uVar2 << 0x20);
    }
    return mVar4;
  }
  __assert_fail("denominator > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c",
                0x6a3,"struct my_rational my_rational_construct(unsigned int, unsigned int)");
}

Assistant:

struct my_rational my_rational_construct(unsigned int numerator,
		unsigned int denominator)
{
	struct my_rational result;

	assert(denominator > 0);
	if (numerator == 0) {
		/* Use 0 / 1 as the way to represent zero. */
		result.n = 0;
		result.d = 1;
	} else {
		unsigned int g = gcd(numerator, denominator);

		result.n = numerator / g;
		result.d = denominator / g;
	}
	return result;
}